

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmAlphaNum local_1c0;
  cmAlphaNum local_190;
  string local_160;
  undefined4 local_13c;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  string local_d8;
  reference local_b8;
  string *ip;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string fullName;
  undefined1 local_68 [8];
  string mod_lower;
  string mod_upper;
  string *module_local;
  string *name_local;
  cmDependsFortran *this_local;
  
  std::__cxx11::string::string((string *)(mod_lower.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  cmFortranModuleAppendUpperLower
            (name,(string *)(mod_lower.field_2._M_local_buf + 8),(string *)local_68);
  std::__cxx11::string::string((string *)&__range1);
  this_00 = &(this->super_cmDepends).IncludePath;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  ip = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&ip);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_008232e8:
      local_13c = 1;
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
      return this_local._7_1_;
    }
    local_b8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    cmAlphaNum::cmAlphaNum(&local_108,local_b8);
    cmAlphaNum::cmAlphaNum(&local_138,'/');
    cmStrCat<std::__cxx11::string>
              (&local_d8,&local_108,&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::__cxx11::string::operator=((string *)&__range1,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar1 = cmsys::SystemTools::FileExists((string *)&__range1,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)module,(string *)&__range1);
      this_local._7_1_ = true;
      goto LAB_008232e8;
    }
    cmAlphaNum::cmAlphaNum(&local_190,local_b8);
    cmAlphaNum::cmAlphaNum(&local_1c0,'/');
    cmStrCat<std::__cxx11::string>
              (&local_160,&local_190,&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&mod_lower.field_2 + 8));
    std::__cxx11::string::operator=((string *)&__range1,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    bVar1 = cmsys::SystemTools::FileExists((string *)&__range1,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)module,(string *)&__range1);
      this_local._7_1_ = true;
      goto LAB_008232e8;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name, std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper;
  std::string mod_lower;
  cmFortranModuleAppendUpperLower(name, mod_upper, mod_lower);

  // Search the include path for the module.
  std::string fullName;
  for (std::string const& ip : this->IncludePath) {
    // Try the lower-case name.
    fullName = cmStrCat(ip, '/', mod_lower);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }

    // Try the upper-case name.
    fullName = cmStrCat(ip, '/', mod_upper);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }
  }
  return false;
}